

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O0

void ctype_addtype(CTState *cts,CType *ct,CTypeID id)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t h;
  CTypeID id_local;
  CType *ct_local;
  CTState *cts_local;
  
  uVar3 = ct->size;
  uVar1 = uVar3 << 0xe | uVar3 >> 0x12;
  uVar2 = (uVar3 ^ ct->info) - uVar1;
  uVar3 = (uVar2 ^ (uVar1 << 5 | (uVar3 << 0xe) >> 0x1b)) - (uVar2 >> 0x13) & 0x7f;
  ct->next = cts->hash[uVar3];
  cts->hash[uVar3] = (CTypeID1)id;
  return;
}

Assistant:

static void ctype_addtype(CTState *cts, CType *ct, CTypeID id)
{
  uint32_t h = ct_hashtype(ct->info, ct->size);
  ct->next = cts->hash[h];
  cts->hash[h] = (CTypeID1)id;
}